

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_marker.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *ctx;
  char **argv_local;
  int argc_local;
  
  glfwInit();
  glfwWindowHint(0x20004,0);
  glfwWindowHint(0x2200b,0x36002);
  glfwWindowHint(0x22001,0x30002);
  glfwWindowHint(0x22002,2);
  glfwWindowHint(0x22003,0);
  window = glfwCreateWindow(300,300,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (window == (GLFWwindow *)0x0) {
    argv_local._4_4_ = 0x7d;
  }
  else {
    glfwMakeContextCurrent(window);
    iVar2 = gladLoadGLES2Loader(glfwGetProcAddress);
    iVar1 = GLAD_GL_EXT_debug_marker;
    if (iVar2 == 0) {
      argv_local._4_4_ = 1;
    }
    else {
      if (GLAD_GL_ES_VERSION_2_0 == 0) {
        __assert_fail("GLAD_GL_ES_VERSION_2_0",
                      "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/egl/gles2/debug_marker.cpp"
                      ,0x62,"int main(int, char **)");
      }
      ctx = "GL_EXT_debug_marker";
      iVar2 = glfwExtensionSupported("GL_EXT_debug_marker");
      if (iVar1 != iVar2) {
        __assert_fail("GLAD_GL_EXT_debug_marker == glfwExtensionSupported(\"GL_EXT_debug_marker\")",
                      "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/egl/gles2/debug_marker.cpp"
                      ,99,"int main(int, char **)");
      }
      init((EVP_PKEY_CTX *)ctx);
      reshape();
      draw();
      glfwDestroyWindow(window);
      glfwTerminate();
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[])
{
   glfwInit();

   glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
   glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
   glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_ES_API);
   glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
   glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

   window = glfwCreateWindow(300, 300, argv[0], NULL, NULL);
   if (!window) {
       return EXIT_SKIP;
   }

   glfwMakeContextCurrent(window);

   if (!gladLoadGLES2Loader((GLADloadproc) glfwGetProcAddress)) {
       return EXIT_FAILURE;
   }

   assert(GLAD_GL_ES_VERSION_2_0);
   assert(GLAD_GL_EXT_debug_marker == glfwExtensionSupported("GL_EXT_debug_marker"));

   init();
   reshape();
   draw();

   glfwDestroyWindow(window);
   glfwTerminate();

   return 0;
}